

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

View<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::operator=
          (View<int,_false,_std::allocator<unsigned_long>_> *this,int *value)

{
  int iVar1;
  bool bVar2;
  size_t *psVar3;
  size_t sVar4;
  reference piVar5;
  undefined1 local_60 [8];
  iterator it;
  ulong local_20;
  size_t j;
  int *value_local;
  View<int,_false,_std::allocator<unsigned_long>_> *this_local;
  
  marray_detail::Assert<bool>(this->data_ != (pointer)0x0);
  bVar2 = isSimple(this);
  if (bVar2) {
    for (local_20 = 0;
        psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size(&this->geometry_),
        local_20 < *psVar3; local_20 = local_20 + 1) {
      this->data_[local_20] = *value;
    }
  }
  else {
    sVar4 = dimension(this);
    if (sVar4 == 1) {
      marray_detail::
      OperateHelperBinaryScalar<(unsigned_short)1,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
      ::operate(this,value,this->data_);
    }
    else {
      sVar4 = dimension(this);
      if (sVar4 == 2) {
        marray_detail::
        OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(this,value,this->data_);
      }
      else {
        sVar4 = dimension(this);
        if (sVar4 == 3) {
          marray_detail::
          OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
          ::operate(this,value,this->data_);
        }
        else {
          sVar4 = dimension(this);
          if (sVar4 == 4) {
            marray_detail::
            OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
            ::operate(this,value,this->data_);
          }
          else {
            sVar4 = dimension(this);
            if (sVar4 == 5) {
              marray_detail::
              OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
              ::operate(this,value,this->data_);
            }
            else {
              sVar4 = dimension(this);
              if (sVar4 == 6) {
                marray_detail::
                OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                ::operate(this,value,this->data_);
              }
              else {
                sVar4 = dimension(this);
                if (sVar4 == 7) {
                  marray_detail::
                  OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                  ::operate(this,value,this->data_);
                }
                else {
                  sVar4 = dimension(this);
                  if (sVar4 == 8) {
                    marray_detail::
                    OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                    ::operate(this,value,this->data_);
                  }
                  else {
                    sVar4 = dimension(this);
                    if (sVar4 == 9) {
                      marray_detail::
                      OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                      ::operate(this,value,this->data_);
                    }
                    else {
                      sVar4 = dimension(this);
                      if (sVar4 == 10) {
                        marray_detail::
                        OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                        ::operate(this,value,this->data_);
                      }
                      else {
                        begin((iterator *)local_60,this);
                        while (bVar2 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore
                                                 ((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)local_60), bVar2) {
                          iVar1 = *value;
                          piVar5 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                                             ((Iterator<int,_false,_std::allocator<unsigned_long>_>
                                               *)local_60);
                          *piVar5 = iVar1;
                          Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
                                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                     local_60);
                        }
                        Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
                                  ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_60)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

inline View<T, isConst, A>& 
View<T, isConst, A>::operator=
(
    const T& value
)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || data_ != 0);
    if(isSimple()) {
        for(std::size_t j=0; j<geometry_.size(); ++j) {
            data_[j] = value;
        }
    }
    else if(dimension() == 1)
        marray_detail::OperateHelperBinaryScalar<1, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 2)
        marray_detail::OperateHelperBinaryScalar<2, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 3)
        marray_detail::OperateHelperBinaryScalar<3, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 4)
        marray_detail::OperateHelperBinaryScalar<4, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 5)
        marray_detail::OperateHelperBinaryScalar<5, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 6)
        marray_detail::OperateHelperBinaryScalar<6, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 7)
        marray_detail::OperateHelperBinaryScalar<7, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 8)
        marray_detail::OperateHelperBinaryScalar<8, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 9)
        marray_detail::OperateHelperBinaryScalar<9, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 10)
        marray_detail::OperateHelperBinaryScalar<10, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else {
        for(iterator it = begin(); it.hasMore(); ++it) {
            *it = value;
        }
    }
    return *this;
}